

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionDAGChecker::ReportError
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorExpressionContext *context,string *expr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream *poVar3;
  cmake *pcVar4;
  string *psVar5;
  cmGeneratorExpressionDAGChecker *pcVar6;
  int iVar7;
  ostringstream e;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  if ((this->CheckResult != DAG) && (context->HadError = true, context->Quiet == false)) {
    pcVar6 = this->Parent;
    local_1b0 = expr;
    if ((pcVar6 == (cmGeneratorExpressionDAGChecker *)0x0) ||
       (pcVar6->Parent != (cmGeneratorExpressionDAGChecker *)0x0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error evaluating generator expression:\n",0x27);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_1b0->_M_dataplus)._M_p,
                          local_1b0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Dependency loop found.",0x16);
      pcVar4 = cmLocalGenerator::GetCMakeInstance(context->LG);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_1d0,&context->Backtrace);
      paVar1 = &local_1d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (pcVar6 != (cmGeneratorExpressionDAGChecker *)0x0) {
        iVar7 = 1;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Loop step ",10);
          poVar3 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
          if (pcVar6->Content == (GeneratorExpressionContent *)0x0) {
            pcVar2 = (local_1b0->_M_dataplus)._M_p;
            local_1d0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d0,pcVar2,pcVar2 + local_1b0->_M_string_length);
          }
          else {
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1d0,pcVar6->Content)
            ;
          }
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          pcVar4 = cmLocalGenerator::GetCMakeInstance(context->LG);
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_1d0,&pcVar6->Backtrace);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          pcVar6 = pcVar6->Parent;
          iVar7 = iVar7 + 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        } while (pcVar6 != (cmGeneratorExpressionDAGChecker *)0x0);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error evaluating generator expression:\n",0x27);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_1b0->_M_dataplus)._M_p,
                          local_1b0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Self reference on target \"",0x1a);
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(context->HeadTarget);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\".\n",3);
      pcVar4 = cmLocalGenerator::GetCMakeInstance(context->LG);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_1d0,&pcVar6->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  return;
}

Assistant:

void cmGeneratorExpressionDAGChecker::ReportError(
  cmGeneratorExpressionContext* context, const std::string& expr)
{
  if (this->CheckResult == DAG) {
    return;
  }

  context->HadError = true;
  if (context->Quiet) {
    return;
  }

  const cmGeneratorExpressionDAGChecker* parent = this->Parent;

  if (parent && !parent->Parent) {
    std::ostringstream e;
    e << "Error evaluating generator expression:\n"
      << "  " << expr << "\n"
      << "Self reference on target \"" << context->HeadTarget->GetName()
      << "\".\n";
    context->LG->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                                  parent->Backtrace);
    return;
  }

  {
    std::ostringstream e;
    /* clang-format off */
  e << "Error evaluating generator expression:\n"
    << "  " << expr << "\n"
    << "Dependency loop found.";
    /* clang-format on */
    context->LG->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                                  context->Backtrace);
  }

  int loopStep = 1;
  while (parent) {
    std::ostringstream e;
    e << "Loop step " << loopStep << "\n"
      << "  "
      << (parent->Content ? parent->Content->GetOriginalExpression() : expr)
      << "\n";
    context->LG->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                                  parent->Backtrace);
    parent = parent->Parent;
    ++loopStep;
  }
}